

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

stbi_uc * bmp_load(stbi *s,int *x,int *y,int *comp,int req_comp)

{
  uchar uVar1;
  int iVar2;
  uint32 uVar3;
  uint32 uVar4;
  uint32 uVar5;
  uint32 uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uchar local_4e8;
  uint local_4e4;
  uchar local_4e0;
  int local_4dc;
  stbi_uc *p2;
  stbi_uc *p1;
  stbi_uc t;
  int a_1;
  uint32 v_1;
  int a;
  int easy;
  int z_1;
  int acount;
  int bcount;
  int gcount;
  int rcount;
  int ashift;
  int bshift;
  int gshift;
  int rshift;
  int v2;
  int v;
  int z;
  int hsz;
  int offset;
  int target;
  int pad;
  int flip_vertically;
  int bpp;
  int width;
  int compress;
  int j;
  int i;
  int psize;
  stbi_uc pal [256] [4];
  uint32 local_50;
  uint32 local_4c;
  uint ma;
  uint mb;
  uint mg;
  uint mr;
  uint8 *out;
  int req_comp_local;
  int *comp_local;
  int *y_local;
  int *x_local;
  stbi *s_local;
  
  mb = 0;
  ma = 0;
  local_4c = 0;
  local_50 = 0;
  j = 0;
  iVar2 = get8(s);
  if ((iVar2 == 0x42) && (iVar2 = get8(s), iVar2 == 0x4d)) {
    get32le(s);
    get16le(s);
    get16le(s);
    uVar3 = get32le(s);
    uVar4 = get32le(s);
    if ((((uVar4 == 0xc) || (uVar4 == 0x28)) || (uVar4 == 0x38)) || (uVar4 == 0x6c)) {
      failure_reason = "bad BMP";
      if (uVar4 == 0xc) {
        uVar5 = get16le(s);
        s->img_x = uVar5;
        uVar5 = get16le(s);
        s->img_y = uVar5;
      }
      else {
        uVar5 = get32le(s);
        s->img_x = uVar5;
        uVar5 = get32le(s);
        s->img_y = uVar5;
      }
      iVar2 = get16le(s);
      if (iVar2 == 1) {
        iVar2 = get16le(s);
        if (iVar2 == 1) {
          e("BMP type not supported: 1-bit");
          s_local = (stbi *)0x0;
        }
        else {
          uVar5 = s->img_y;
          uVar6 = s->img_y;
          if ((int)uVar6 < 1) {
            uVar6 = -uVar6;
          }
          s->img_y = uVar6;
          if (uVar4 == 0xc) {
            if (iVar2 < 0x18) {
              j = (int)(uVar3 - 0x26) / 3;
            }
          }
          else {
            uVar6 = get32le(s);
            if ((uVar6 == 1) || (uVar6 == 2)) {
              e("BMP type not supported: RLE");
              return (stbi_uc *)0x0;
            }
            get32le(s);
            get32le(s);
            get32le(s);
            get32le(s);
            get32le(s);
            if ((uVar4 == 0x28) || (uVar4 == 0x38)) {
              if (uVar4 == 0x38) {
                get32le(s);
                get32le(s);
                get32le(s);
                get32le(s);
              }
              if ((iVar2 == 0x10) || (iVar2 == 0x20)) {
                if (uVar6 == 0) {
                  if (iVar2 == 0x20) {
                    mb = 0xff0000;
                    ma = 0xff00;
                    local_4c = 0xff;
                  }
                  else {
                    mb = 0x7c00;
                    ma = 0x3e0;
                    local_4c = 0x1f;
                  }
                }
                else {
                  if (uVar6 != 3) {
                    return (stbi_uc *)0x0;
                  }
                  mb = get32le(s);
                  ma = get32le(s);
                  local_4c = get32le(s);
                  if ((mb == ma) && (ma == local_4c)) {
                    return (stbi_uc *)0x0;
                  }
                }
              }
            }
            else {
              if (uVar4 != 0x6c) {
                __assert_fail("hsz == 108",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sidneydijkstra[P]SDEN/external/soil/src/stb_image_aug.c"
                              ,0xa15,"stbi_uc *bmp_load(stbi *, int *, int *, int *, int)");
              }
              mb = get32le(s);
              ma = get32le(s);
              local_4c = get32le(s);
              local_50 = get32le(s);
              get32le(s);
              for (compress = 0; compress < 0xc; compress = compress + 1) {
                get32le(s);
              }
            }
            if (iVar2 < 0x10) {
              j = (int)((uVar3 - 0xe) - uVar4) >> 2;
            }
          }
          iVar7 = 3;
          if (local_50 != 0) {
            iVar7 = 4;
          }
          s->img_n = iVar7;
          if ((req_comp == 0) || (hsz = req_comp, req_comp < 3)) {
            hsz = s->img_n;
          }
          _mg = (stbi *)malloc((ulong)(hsz * s->img_x * s->img_y));
          if (_mg == (stbi *)0x0) {
            e("Out of memory");
            s_local = (stbi *)0x0;
          }
          else {
            if (iVar2 < 0x10) {
              v2 = 0;
              if ((j == 0) || (0x100 < j)) {
                free(_mg);
                e("Corrupt BMP");
                return (stbi_uc *)0x0;
              }
              for (compress = 0; compress < j; compress = compress + 1) {
                iVar7 = get8(s);
                *(char *)((long)&i + (long)compress * 4 + 2) = (char)iVar7;
                iVar7 = get8(s);
                *(char *)((long)&i + (long)compress * 4 + 1) = (char)iVar7;
                iVar7 = get8(s);
                *(char *)(&i + compress) = (char)iVar7;
                if (uVar4 != 0xc) {
                  get8(s);
                }
                *(undefined1 *)((long)&i + (long)compress * 4 + 3) = 0xff;
              }
              iVar7 = 4;
              if (uVar4 == 0xc) {
                iVar7 = 3;
              }
              skip(s,((uVar3 - 0xe) - uVar4) - j * iVar7);
              if (iVar2 == 4) {
                flip_vertically = s->img_x + 1 >> 1;
              }
              else {
                if (iVar2 != 8) {
                  free(_mg);
                  e("Corrupt BMP");
                  return (stbi_uc *)0x0;
                }
                flip_vertically = s->img_x;
              }
              for (width = 0; width < (int)s->img_y; width = width + 1) {
                for (compress = 0; compress < (int)s->img_x; compress = compress + 2) {
                  rshift = get8(s);
                  gshift = 0;
                  if (iVar2 == 4) {
                    gshift = rshift & 0xf;
                    rshift = rshift >> 4;
                  }
                  *(uchar *)((long)&_mg->img_x + (long)v2) = (uchar)(&i)[rshift];
                  *(uchar *)((long)&_mg->img_x + (long)(v2 + 1)) =
                       *(uchar *)((long)&i + (long)rshift * 4 + 1);
                  *(uchar *)((long)&_mg->img_x + (long)(v2 + 2)) =
                       *(uchar *)((long)&i + (long)rshift * 4 + 2);
                  iVar7 = v2 + 3;
                  if (hsz == 4) {
                    *(uchar *)((long)&_mg->img_x + (long)(v2 + 3)) = 0xff;
                    iVar7 = v2 + 4;
                  }
                  v2 = iVar7;
                  if (compress + 1U == s->img_x) break;
                  if (iVar2 == 8) {
                    local_4dc = get8(s);
                  }
                  else {
                    local_4dc = gshift;
                  }
                  *(uchar *)((long)&_mg->img_x + (long)v2) = (uchar)(&i)[local_4dc];
                  *(uchar *)((long)&_mg->img_x + (long)(v2 + 1)) =
                       *(uchar *)((long)&i + (long)local_4dc * 4 + 1);
                  *(uchar *)((long)&_mg->img_x + (long)(v2 + 2)) =
                       *(uchar *)((long)&i + (long)local_4dc * 4 + 2);
                  iVar7 = v2 + 3;
                  if (hsz == 4) {
                    *(uchar *)((long)&_mg->img_x + (long)(v2 + 3)) = 0xff;
                    iVar7 = v2 + 4;
                  }
                  v2 = iVar7;
                }
                skip(s,-flip_vertically & 3);
              }
            }
            else {
              bshift = 0;
              ashift = 0;
              rcount = 0;
              gcount = 0;
              bcount = 0;
              acount = 0;
              z_1 = 0;
              easy = 0;
              a = 0;
              v_1 = 0;
              skip(s,(uVar3 - 0xe) - uVar4);
              if (iVar2 == 0x18) {
                flip_vertically = s->img_x * 3;
              }
              else if (iVar2 == 0x10) {
                flip_vertically = s->img_x << 1;
              }
              else {
                flip_vertically = 0;
              }
              if (iVar2 == 0x18) {
                v_1 = 1;
              }
              else if ((((iVar2 == 0x20) && (local_4c == 0xff)) && (ma == 0xff00)) &&
                      ((mb == 0xff000000 && (local_50 == 0xff000000)))) {
                v_1 = 2;
              }
              if (v_1 == 0) {
                if (((mb == 0) || (ma == 0)) || (local_4c == 0)) {
                  e("Corrupt BMP");
                  return (stbi_uc *)0x0;
                }
                iVar7 = high_bit(mb);
                bshift = iVar7 + -7;
                bcount = bitcount(mb);
                iVar7 = high_bit(ma);
                ashift = iVar7 + -7;
                acount = bitcount(mb);
                iVar7 = high_bit(local_4c);
                rcount = iVar7 + -7;
                z_1 = bitcount(mb);
                iVar7 = high_bit(local_50);
                gcount = iVar7 + -7;
                easy = bitcount(mb);
              }
              for (width = 0; width < (int)s->img_y; width = width + 1) {
                if (v_1 == 0) {
                  for (compress = 0; compress < (int)s->img_x; compress = compress + 1) {
                    if (iVar2 == 0x10) {
                      local_4e4 = get16le(s);
                    }
                    else {
                      local_4e4 = get32le(s);
                    }
                    iVar7 = shiftsigned(local_4e4 & mb,bshift,bcount);
                    *(uchar *)((long)&_mg->img_x + (long)a) = (uchar)iVar7;
                    iVar7 = shiftsigned(local_4e4 & ma,ashift,acount);
                    *(uchar *)((long)&_mg->img_x + (long)(a + 1)) = (uchar)iVar7;
                    iVar7 = shiftsigned(local_4e4 & local_4c,rcount,z_1);
                    *(uchar *)((long)&_mg->img_x + (long)(a + 2)) = (uchar)iVar7;
                    if (local_50 == 0) {
                      local_4e8 = 0xff;
                    }
                    else {
                      iVar7 = shiftsigned(local_4e4 & local_50,gcount,easy);
                      local_4e8 = (uchar)iVar7;
                    }
                    iVar7 = a + 3;
                    if (hsz == 4) {
                      *(uchar *)((long)&_mg->img_x + (long)(a + 3)) = local_4e8;
                      iVar7 = a + 4;
                    }
                    a = iVar7;
                  }
                }
                else {
                  for (compress = 0; compress < (int)s->img_x; compress = compress + 1) {
                    iVar7 = get8(s);
                    *(uchar *)((long)&_mg->img_x + (long)(a + 2)) = (uchar)iVar7;
                    iVar7 = get8(s);
                    *(uchar *)((long)&_mg->img_x + (long)(a + 1)) = (uchar)iVar7;
                    iVar7 = get8(s);
                    *(uchar *)((long)&_mg->img_x + (long)a) = (uchar)iVar7;
                    if (v_1 == 2) {
                      iVar7 = get8(s);
                      local_4e0 = (uchar)iVar7;
                    }
                    else {
                      local_4e0 = 0xff;
                    }
                    iVar7 = a + 3;
                    if (hsz == 4) {
                      *(uchar *)((long)&_mg->img_x + (long)(a + 3)) = local_4e0;
                      iVar7 = a + 4;
                    }
                    a = iVar7;
                  }
                }
                skip(s,-flip_vertically & 3);
              }
            }
            if (0 < (int)uVar5) {
              for (width = 0; width < (int)s->img_y >> 1; width = width + 1) {
                uVar8 = width * s->img_x * hsz;
                uVar9 = ((s->img_y - 1) - width) * s->img_x * hsz;
                for (compress = 0; compress < (int)(s->img_x * hsz); compress = compress + 1) {
                  uVar1 = *(uchar *)((long)&_mg->img_x + (long)compress + (ulong)uVar8);
                  *(uchar *)((long)&_mg->img_x + (long)compress + (ulong)uVar8) =
                       *(uchar *)((long)&_mg->img_x + (long)compress + (ulong)uVar9);
                  *(uchar *)((long)&_mg->img_x + (long)compress + (ulong)uVar9) = uVar1;
                }
              }
            }
            if (((req_comp == 0) || (req_comp == hsz)) ||
               (_mg = (stbi *)convert_format((uchar *)_mg,hsz,req_comp,s->img_x,s->img_y),
               s_local = _mg, _mg != (stbi *)0x0)) {
              *x = s->img_x;
              *y = s->img_y;
              if (comp != (int *)0x0) {
                *comp = hsz;
              }
              s_local = _mg;
            }
          }
        }
      }
      else {
        s_local = (stbi *)0x0;
      }
    }
    else {
      e("BMP type not supported: unknown");
      s_local = (stbi *)0x0;
    }
  }
  else {
    e("Corrupt BMP");
    s_local = (stbi *)0x0;
  }
  return (stbi_uc *)s_local;
}

Assistant:

static stbi_uc *bmp_load(stbi *s, int *x, int *y, int *comp, int req_comp)
{
   uint8 *out;
   unsigned int mr=0,mg=0,mb=0,ma=0;
   stbi_uc pal[256][4];
   int psize=0,i,j,compress=0,width;
   int bpp, flip_vertically, pad, target, offset, hsz;
   if (get8(s) != 'B' || get8(s) != 'M') return epuc("not BMP", "Corrupt BMP");
   get32le(s); // discard filesize
   get16le(s); // discard reserved
   get16le(s); // discard reserved
   offset = get32le(s);
   hsz = get32le(s);
   if (hsz != 12 && hsz != 40 && hsz != 56 && hsz != 108) return epuc("unknown BMP", "BMP type not supported: unknown");
   failure_reason = "bad BMP";
   if (hsz == 12) {
      s->img_x = get16le(s);
      s->img_y = get16le(s);
   } else {
      s->img_x = get32le(s);
      s->img_y = get32le(s);
   }
   if (get16le(s) != 1) return 0;
   bpp = get16le(s);
   if (bpp == 1) return epuc("monochrome", "BMP type not supported: 1-bit");
   flip_vertically = ((int) s->img_y) > 0;
   s->img_y = abs((int) s->img_y);
   if (hsz == 12) {
      if (bpp < 24)
         psize = (offset - 14 - 24) / 3;
   } else {
      compress = get32le(s);
      if (compress == 1 || compress == 2) return epuc("BMP RLE", "BMP type not supported: RLE");
      get32le(s); // discard sizeof
      get32le(s); // discard hres
      get32le(s); // discard vres
      get32le(s); // discard colorsused
      get32le(s); // discard max important
      if (hsz == 40 || hsz == 56) {
         if (hsz == 56) {
            get32le(s);
            get32le(s);
            get32le(s);
            get32le(s);
         }
         if (bpp == 16 || bpp == 32) {
            mr = mg = mb = 0;
            if (compress == 0) {
               if (bpp == 32) {
                  mr = 0xff << 16;
                  mg = 0xff <<  8;
                  mb = 0xff <<  0;
               } else {
                  mr = 31 << 10;
                  mg = 31 <<  5;
                  mb = 31 <<  0;
               }
            } else if (compress == 3) {
               mr = get32le(s);
               mg = get32le(s);
               mb = get32le(s);
               // not documented, but generated by photoshop and handled by mspaint
               if (mr == mg && mg == mb) {
                  // ?!?!?
                  return NULL;
               }
            } else
               return NULL;
         }
      } else {
         assert(hsz == 108);
         mr = get32le(s);
         mg = get32le(s);
         mb = get32le(s);
         ma = get32le(s);
         get32le(s); // discard color space
         for (i=0; i < 12; ++i)
            get32le(s); // discard color space parameters
      }
      if (bpp < 16)
         psize = (offset - 14 - hsz) >> 2;
   }
   s->img_n = ma ? 4 : 3;
   if (req_comp && req_comp >= 3) // we can directly decode 3 or 4
      target = req_comp;
   else
      target = s->img_n; // if they want monochrome, we'll post-convert
   out = (stbi_uc *) malloc(target * s->img_x * s->img_y);
   if (!out) return epuc("outofmem", "Out of memory");
   if (bpp < 16) {
      int z=0;
      if (psize == 0 || psize > 256) { free(out); return epuc("invalid", "Corrupt BMP"); }
      for (i=0; i < psize; ++i) {
         pal[i][2] = get8(s);
         pal[i][1] = get8(s);
         pal[i][0] = get8(s);
         if (hsz != 12) get8(s);
         pal[i][3] = 255;
      }
      skip(s, offset - 14 - hsz - psize * (hsz == 12 ? 3 : 4));
      if (bpp == 4) width = (s->img_x + 1) >> 1;
      else if (bpp == 8) width = s->img_x;
      else { free(out); return epuc("bad bpp", "Corrupt BMP"); }
      pad = (-width)&3;
      for (j=0; j < (int) s->img_y; ++j) {
         for (i=0; i < (int) s->img_x; i += 2) {
            int v=get8(s),v2=0;
            if (bpp == 4) {
               v2 = v & 15;
               v >>= 4;
            }
            out[z++] = pal[v][0];
            out[z++] = pal[v][1];
            out[z++] = pal[v][2];
            if (target == 4) out[z++] = 255;
            if (i+1 == (int) s->img_x) break;
            v = (bpp == 8) ? get8(s) : v2;
            out[z++] = pal[v][0];
            out[z++] = pal[v][1];
            out[z++] = pal[v][2];
            if (target == 4) out[z++] = 255;
         }
         skip(s, pad);
      }
   } else {
      int rshift=0,gshift=0,bshift=0,ashift=0,rcount=0,gcount=0,bcount=0,acount=0;
      int z = 0;
      int easy=0;
      skip(s, offset - 14 - hsz);
      if (bpp == 24) width = 3 * s->img_x;
      else if (bpp == 16) width = 2*s->img_x;
      else /* bpp = 32 and pad = 0 */ width=0;
      pad = (-width) & 3;
      if (bpp == 24) {
         easy = 1;
      } else if (bpp == 32) {
         if (mb == 0xff && mg == 0xff00 && mr == 0xff000000 && ma == 0xff000000)
            easy = 2;
      }
      if (!easy) {
         if (!mr || !mg || !mb) return epuc("bad masks", "Corrupt BMP");
         // right shift amt to put high bit in position #7
         rshift = high_bit(mr)-7; rcount = bitcount(mr);
         gshift = high_bit(mg)-7; gcount = bitcount(mr);
         bshift = high_bit(mb)-7; bcount = bitcount(mr);
         ashift = high_bit(ma)-7; acount = bitcount(mr);
      }
      for (j=0; j < (int) s->img_y; ++j) {
         if (easy) {
            for (i=0; i < (int) s->img_x; ++i) {
               int a;
               out[z+2] = get8(s);
               out[z+1] = get8(s);
               out[z+0] = get8(s);
               z += 3;
               a = (easy == 2 ? get8(s) : 255);
               if (target == 4) out[z++] = a;
            }
         } else {
            for (i=0; i < (int) s->img_x; ++i) {
               uint32 v = (bpp == 16 ? get16le(s) : get32le(s));
               int a;
               out[z++] = shiftsigned(v & mr, rshift, rcount);
               out[z++] = shiftsigned(v & mg, gshift, gcount);
               out[z++] = shiftsigned(v & mb, bshift, bcount);
               a = (ma ? shiftsigned(v & ma, ashift, acount) : 255);
               if (target == 4) out[z++] = a;
            }
         }
         skip(s, pad);
      }
   }
   if (flip_vertically) {
      stbi_uc t;
      for (j=0; j < (int) s->img_y>>1; ++j) {
         stbi_uc *p1 = out +      j     *s->img_x*target;
         stbi_uc *p2 = out + (s->img_y-1-j)*s->img_x*target;
         for (i=0; i < (int) s->img_x*target; ++i) {
            t = p1[i], p1[i] = p2[i], p2[i] = t;
         }
      }
   }

   if (req_comp && req_comp != target) {
      out = convert_format(out, target, req_comp, s->img_x, s->img_y);
      if (out == NULL) return out; // convert_format frees input on failure
   }

   *x = s->img_x;
   *y = s->img_y;
   if (comp) *comp = target;
   return out;
}